

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool anon_unknown.dwarf_25095d::initializeOutputStream
               (char *Buf,size_t *N,OutputStream *S,size_t InitSize)

{
  if (Buf == (char *)0x0) {
    Buf = (char *)malloc(InitSize);
    if (Buf == (char *)0x0) {
      return true;
    }
  }
  else {
    InitSize = *N;
  }
  S->CurrentPosition = 0;
  S->Buffer = Buf;
  S->BufferCapacity = InitSize;
  return false;
}

Assistant:

bool initializeOutputStream(char *Buf, size_t *N, OutputStream &S,
                            size_t InitSize) {
  size_t BufferSize;
  if (Buf == nullptr) {
    Buf = static_cast<char *>(std::malloc(InitSize));
    if (Buf == nullptr)
      return true;
    BufferSize = InitSize;
  } else
    BufferSize = *N;

  S.reset(Buf, BufferSize);
  return false;
}